

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O0

void __thiscall
World::World(World *this,
            array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
            *dbinfo,Config *eoserv_config,Config *admin_config)

{
  uint uVar1;
  undefined4 type;
  Config *this_00;
  bool bVar2;
  int iVar3;
  int iVar4;
  pointer pvVar5;
  reference pvVar6;
  undefined8 uVar7;
  reference pvVar8;
  reference pass;
  reference db;
  mapped_type *pmVar9;
  EIF *this_01;
  ENF *this_02;
  ESF *this_03;
  ECF *this_04;
  reference this_05;
  NPC_Data *this_06;
  pointer pNVar10;
  Map *this_07;
  reference ppMVar11;
  size_type sVar12;
  vector<ENF_Data_Base<ENF>,_std::allocator<ENF_Data_Base<ENF>_>_> *this_08;
  reference pEVar13;
  short *psVar14;
  size_type sVar15;
  TimeEvent *pTVar16;
  reference pvVar17;
  Board *this_09;
  reference ppBVar18;
  GuildManager *this_10;
  double dVar19;
  undefined1 auVar20 [16];
  __enable_if_t<is_constructible<value_type,_pair<short,_shared_ptr<Quest>_>_>::value,_pair<iterator,_bool>_>
  _Var21;
  ulong local_880;
  size_t i_4;
  size_t i_3;
  key_type local_868;
  allocator<char> local_841;
  key_type local_840;
  undefined1 local_81a;
  allocator<char> local_819;
  key_type local_818;
  allocator<char> local_7f1;
  key_type local_7f0;
  undefined1 local_7ca;
  allocator<char> local_7c9;
  key_type local_7c8;
  allocator<char> local_7a1;
  key_type local_7a0;
  undefined1 local_77a;
  allocator<char> local_779;
  key_type local_778;
  allocator<char> local_751;
  key_type local_750;
  undefined1 local_72a;
  allocator<char> local_729;
  key_type local_728;
  allocator<char> local_701;
  key_type local_700;
  allocator<char> local_6d9;
  key_type local_6d8;
  undefined1 local_6b2;
  allocator<char> local_6b1;
  key_type local_6b0;
  allocator<char> local_689;
  key_type local_688;
  undefined1 local_662;
  allocator<char> local_661;
  key_type local_660;
  allocator<char> local_639;
  key_type local_638;
  TimeEvent *local_618;
  TimeEvent *event;
  undefined1 local_608;
  pair<short,_std::shared_ptr<Quest>_> local_600;
  World *local_5e8;
  undefined1 local_5e0 [8];
  shared_ptr<Quest> q;
  short i_2;
  ENF_Data_Base<ENF> npc_1;
  iterator __end1;
  iterator __begin1;
  vector<ENF_Data_Base<ENF>,_std::allocator<ENF_Data_Base<ENF>_>_> *__range1;
  key_type local_560;
  short local_53c;
  allocator<char> local_539;
  undefined1 local_538 [4];
  short max_quest;
  int local_514;
  uint local_510;
  int i_1;
  int loaded;
  reference local_4e8;
  value_type *npc;
  size_t i;
  size_t num_npcs;
  key_type local_4c8;
  string local_4a8;
  undefined1 local_482;
  allocator<char> local_481;
  key_type local_480;
  string local_460;
  undefined1 local_43a;
  allocator<char> local_439;
  key_type local_438;
  string local_418;
  undefined1 local_3f2;
  allocator<char> local_3f1;
  key_type local_3f0;
  string local_3d0;
  allocator<char> local_3a9;
  key_type local_3a8;
  byte local_382;
  allocator<char> local_381;
  undefined1 local_380 [6];
  bool auto_split;
  string local_360;
  allocator<char> local_339;
  key_type local_338;
  string local_318;
  allocator<char> local_2f1;
  key_type local_2f0;
  string local_2d0;
  allocator<char> local_2a9;
  key_type local_2a8;
  string local_288;
  allocator<char> local_261;
  key_type local_260;
  string local_240;
  allocator<char> local_219;
  key_type local_218;
  string local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  allocator<char> local_191;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  allocator<char> local_109;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  string local_a8 [8];
  string dbdesc;
  Engine engine;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
  local_60;
  string local_58;
  Config *local_28;
  Config *admin_config_local;
  Config *eoserv_config_local;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
  *dbinfo_local;
  World *this_local;
  
  local_28 = admin_config;
  admin_config_local = eoserv_config;
  eoserv_config_local = (Config *)dbinfo;
  dbinfo_local = (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
                  *)this;
  Timer::Timer(&this->timer);
  Database::Database(&this->db);
  std::
  vector<std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>,_std::allocator<std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>_>_>
  ::vector(&this->npc_data);
  Config::Config(&this->config);
  Config::Config(&this->admin_config);
  Config::Config(&this->drops_config);
  Config::Config(&this->shops_config);
  Config::Config(&this->arenas_config);
  Config::Config(&this->formulas_config);
  Config::Config(&this->home_config);
  Config::Config(&this->skills_config);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  ::unordered_map(&this->formulas_cache);
  this_00 = admin_config_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&engine,"ServerLanguage",
             (allocator<char> *)(dbdesc.field_2._M_local_buf + 0xf));
  local_60._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
       ::find(&this_00->
               super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
              ,(key_type *)&engine);
  pvVar5 = std::__detail::
           _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_false,_true>
           ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_false,_true>
                         *)&local_60);
  util::variant::operator_cast_to_string(&local_58,&pvVar5->second);
  I18N::I18N(&this->i18n,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&engine);
  std::allocator<char>::~allocator((allocator<char> *)(dbdesc.field_2._M_local_buf + 0xf));
  std::vector<Character_*,_std::allocator<Character_*>_>::vector(&this->characters);
  std::vector<Party_*,_std::allocator<Party_*>_>::vector(&this->parties);
  std::vector<Map_*,_std::allocator<Map_*>_>::vector(&this->maps);
  std::vector<Home_*,_std::allocator<Home_*>_>::vector(&this->homes);
  std::
  map<short,_std::shared_ptr<Quest>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest>_>_>_>
  ::map(&this->quests);
  std::vector<int,_std::allocator<int>_>::vector(&this->instrument_ids);
  this->admin_count = 0;
  if ((int)((this->timer).resolution * 1000.0) < 2) {
    Console::Out("Timers set at < 1 ms resolution");
  }
  else {
    Console::Out("Timers set at approx. %i ms resolution",
                 (ulong)(uint)(int)((this->timer).resolution * 1000.0));
  }
  Config::operator=(&this->config,admin_config_local);
  Config::operator=(&this->admin_config,local_28);
  std::__cxx11::string::string(local_a8);
  pvVar6 = std::
           array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
           ::operator[](dbinfo,0);
  util::lowercase(&local_c8,pvVar6);
  iVar3 = std::__cxx11::string::compare((char *)&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  if (iVar3 == 0) {
    dbdesc.field_2._8_4_ = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"SQLite: ",&local_109);
    pvVar6 = std::
             array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
             ::operator[](dbinfo,1);
    std::operator+(&local_e8,&local_108,pvVar6);
    std::__cxx11::string::operator=(local_a8,(string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator(&local_109);
  }
  else {
    dbdesc.field_2._8_4_ = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"MySQL: ",&local_191);
    pvVar6 = std::
             array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
             ::operator[](dbinfo,2);
    std::operator+(&local_170,&local_190,pvVar6);
    std::operator+(&local_150,&local_170,"@");
    pvVar6 = std::
             array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
             ::operator[](dbinfo,1);
    std::operator+(&local_130,&local_150,pvVar6);
    std::__cxx11::string::operator=(local_a8,(string *)&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_190);
    std::allocator<char>::~allocator(&local_191);
    pvVar6 = std::
             array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
             ::operator[](dbinfo,5);
    bVar2 = std::operator!=(pvVar6,"0");
    if (bVar2) {
      pvVar6 = std::
               array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
               ::operator[](dbinfo,5);
      bVar2 = std::operator!=(pvVar6,"3306");
      if (bVar2) {
        pvVar6 = std::
                 array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
                 ::operator[](dbinfo,5);
        std::operator+(&local_1b8,":",pvVar6);
        std::__cxx11::string::operator+=(local_a8,(string *)&local_1b8);
        std::__cxx11::string::~string((string *)&local_1b8);
      }
    }
    pvVar6 = std::
             array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
             ::operator[](dbinfo,4);
    std::operator+(&local_1d8,"/",pvVar6);
    std::__cxx11::string::operator+=(local_a8,(string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
  }
  uVar7 = std::__cxx11::string::c_str();
  Console::Out("Connecting to database (%s)...",uVar7);
  type = dbdesc.field_2._8_4_;
  pvVar6 = std::
           array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
           ::operator[](dbinfo,1);
  pvVar8 = std::
           array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
           ::operator[](dbinfo,5);
  iVar3 = util::to_int(pvVar8);
  pvVar8 = std::
           array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
           ::operator[](dbinfo,2);
  pass = std::
         array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
         ::operator[](dbinfo,3);
  db = std::
       array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>::
       operator[](dbinfo,4);
  Database::Connect(&this->db,type,pvVar6,(unsigned_short)iVar3,pvVar8,pass,db);
  BeginDB(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"DropsFile",&local_219);
  pmVar9 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(this->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_218);
  util::variant::operator_cast_to_string(&local_1f8,pmVar9);
  Config::Read(&this->drops_config,&local_1f8,false);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator(&local_219);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,"ShopsFile",&local_261);
  pmVar9 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(this->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_260);
  util::variant::operator_cast_to_string(&local_240,pmVar9);
  Config::Read(&this->shops_config,&local_240,false);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator(&local_261);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"ArenasFile",&local_2a9);
  pmVar9 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(this->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_2a8);
  util::variant::operator_cast_to_string(&local_288,pmVar9);
  Config::Read(&this->arenas_config,&local_288,false);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::allocator<char>::~allocator(&local_2a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"FormulasFile",&local_2f1)
  ;
  pmVar9 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(this->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_2f0);
  util::variant::operator_cast_to_string(&local_2d0,pmVar9);
  Config::Read(&this->formulas_config,&local_2d0,false);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::allocator<char>::~allocator(&local_2f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"HomeFile",&local_339);
  pmVar9 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(this->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_338);
  util::variant::operator_cast_to_string(&local_318,pmVar9);
  Config::Read(&this->home_config,&local_318,false);
  std::__cxx11::string::~string((string *)&local_318);
  std::__cxx11::string::~string((string *)&local_338);
  std::allocator<char>::~allocator(&local_339);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_380,"SkillsFile",&local_381);
  pmVar9 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(this->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,(key_type *)local_380);
  util::variant::operator_cast_to_string(&local_360,pmVar9);
  Config::Read(&this->skills_config,&local_360,false);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::string::~string((string *)local_380);
  std::allocator<char>::~allocator(&local_381);
  UpdateConfig(this);
  LoadHome(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3a8,"AutoSplitPubFiles",&local_3a9);
  pmVar9 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(this->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_3a8);
  bVar2 = util::variant::operator_cast_to_bool(pmVar9);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::allocator<char>::~allocator(&local_3a9);
  local_382 = bVar2;
  this_01 = (EIF *)operator_new(0x38);
  local_3f2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f0,"EIF",&local_3f1);
  pmVar9 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(this->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_3f0);
  util::variant::operator_cast_to_string(&local_3d0,pmVar9);
  EIF::EIF(this_01,&local_3d0,(bool)(local_382 & 1));
  local_3f2 = 0;
  this->eif = this_01;
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::allocator<char>::~allocator(&local_3f1);
  this_02 = (ENF *)operator_new(0x38);
  local_43a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_438,"ENF",&local_439);
  pmVar9 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(this->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_438);
  util::variant::operator_cast_to_string(&local_418,pmVar9);
  ENF::ENF(this_02,&local_418,(bool)(local_382 & 1));
  local_43a = 0;
  this->enf = this_02;
  std::__cxx11::string::~string((string *)&local_418);
  std::__cxx11::string::~string((string *)&local_438);
  std::allocator<char>::~allocator(&local_439);
  this_03 = (ESF *)operator_new(0x38);
  local_482 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_480,"ESF",&local_481);
  pmVar9 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(this->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_480);
  util::variant::operator_cast_to_string(&local_460,pmVar9);
  ESF::ESF(this_03,&local_460,(bool)(local_382 & 1));
  local_482 = 0;
  this->esf = this_03;
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_480);
  std::allocator<char>::~allocator(&local_481);
  this_04 = (ECF *)operator_new(0x38);
  num_npcs._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,"ECF",(allocator<char> *)((long)&num_npcs + 7));
  pmVar9 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(this->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_4c8);
  util::variant::operator_cast_to_string(&local_4a8,pmVar9);
  ECF::ECF(this_04,&local_4a8,(bool)(local_382 & 1));
  num_npcs._6_1_ = 0;
  this->ecf = this_04;
  std::__cxx11::string::~string((string *)&local_4a8);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&num_npcs + 7));
  i = std::vector<ENF_Data_Base<ENF>,_std::allocator<ENF_Data_Base<ENF>_>_>::size(&this->enf->data);
  std::
  vector<std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>,_std::allocator<std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>_>_>
  ::resize(&this->npc_data,i);
  for (npc = (value_type *)0x0; npc < i;
      npc = (value_type *)
            ((long)&(npc->_M_t).super___uniq_ptr_impl<NPC_Data,_std::default_delete<NPC_Data>_>._M_t
                    .super__Tuple_impl<0UL,_NPC_Data_*,_std::default_delete<NPC_Data>_>.
                    super__Head_base<0UL,_NPC_Data_*,_false>._M_head_impl + 1)) {
    this_05 = std::
              vector<std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>,_std::allocator<std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>_>_>
              ::operator[](&this->npc_data,(size_type)npc);
    local_4e8 = this_05;
    this_06 = (NPC_Data *)operator_new(0xc0);
    NPC_Data::NPC_Data(this_06,this,(short)npc);
    std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>::reset(this_05,this_06);
    pNVar10 = std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>::operator->(local_4e8);
    if (pNVar10->id != 0) {
      pNVar10 = std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>::operator->(local_4e8);
      NPC_Data::LoadShopDrop(pNVar10);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&loaded,"Maps",(allocator<char> *)((long)&i_1 + 3));
  pmVar9 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(this->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,(key_type *)&loaded);
  iVar3 = util::variant::operator_cast_to_int(pmVar9);
  std::vector<Map_*,_std::allocator<Map_*>_>::resize(&this->maps,(long)iVar3);
  std::__cxx11::string::~string((string *)&loaded);
  std::allocator<char>::~allocator((allocator<char> *)((long)&i_1 + 3));
  local_510 = 0;
  local_514 = 0;
  while( true ) {
    iVar3 = local_514;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_538,"Maps",&local_539);
    pmVar9 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
             ::operator[](&(this->config).
                           super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                          ,(key_type *)local_538);
    iVar4 = util::variant::operator_cast_to_int(pmVar9);
    std::__cxx11::string::~string((string *)local_538);
    std::allocator<char>::~allocator(&local_539);
    uVar1 = local_510;
    if (iVar4 <= iVar3) break;
    this_07 = (Map *)operator_new(0xd8);
    Map::Map(this_07,local_514 + 1,this);
    ppMVar11 = std::vector<Map_*,_std::allocator<Map_*>_>::operator[](&this->maps,(long)local_514);
    *ppMVar11 = this_07;
    ppMVar11 = std::vector<Map_*,_std::allocator<Map_*>_>::operator[](&this->maps,(long)local_514);
    if (((*ppMVar11)->exists & 1U) != 0) {
      local_510 = local_510 + 1;
    }
    local_514 = local_514 + 1;
  }
  sVar12 = std::vector<Map_*,_std::allocator<Map_*>_>::size(&this->maps);
  Console::Out("%i/%i maps loaded.",(ulong)uVar1,sVar12 & 0xffffffff);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_560,"Quests",(allocator<char> *)((long)&__range1 + 7));
  pmVar9 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(this->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_560);
  iVar3 = util::variant::operator_cast_to_int(pmVar9);
  std::__cxx11::string::~string((string *)&local_560);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  this_08 = &this->enf->data;
  local_53c = (short)iVar3;
  __end1 = std::vector<ENF_Data_Base<ENF>,_std::allocator<ENF_Data_Base<ENF>_>_>::begin(this_08);
  npc_1._64_8_ = std::vector<ENF_Data_Base<ENF>,_std::allocator<ENF_Data_Base<ENF>_>_>::end(this_08)
  ;
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<ENF_Data_Base<ENF>_*,_std::vector<ENF_Data_Base<ENF>,_std::allocator<ENF_Data_Base<ENF>_>_>_>
                                     *)&npc_1.maxdam), bVar2) {
    pEVar13 = __gnu_cxx::
              __normal_iterator<ENF_Data_Base<ENF>_*,_std::vector<ENF_Data_Base<ENF>,_std::allocator<ENF_Data_Base<ENF>_>_>_>
              ::operator*(&__end1);
    ENF_Data_Base<ENF>::ENF_Data_Base((ENF_Data_Base<ENF> *)&stack0xfffffffffffffa38,pEVar13);
    if (npc_1.graphic == 0xf) {
      psVar14 = std::max<short>(&local_53c,&npc_1.boss);
      local_53c = *psVar14;
    }
    ENF_Data_Base<ENF>::~ENF_Data_Base((ENF_Data_Base<ENF> *)&stack0xfffffffffffffa38);
    __gnu_cxx::
    __normal_iterator<ENF_Data_Base<ENF>_*,_std::vector<ENF_Data_Base<ENF>,_std::allocator<ENF_Data_Base<ENF>_>_>_>
    ::operator++(&__end1);
  }
  for (q.super___shared_ptr<Quest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_2_ = 0;
      q.super___shared_ptr<Quest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_2_ <= local_53c;
      q.super___shared_ptr<Quest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_2_ =
           q.super___shared_ptr<Quest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_2_ + 1) {
    local_5e8 = this;
    std::make_shared<Quest,short&,World*>
              ((short *)local_5e0,
               (World **)
               ((long)&q.super___shared_ptr<Quest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 6
               ));
    std::make_pair<short&,std::shared_ptr<Quest>>
              (&local_600,
               (short *)((long)&q.super___shared_ptr<Quest,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                                _M_pi + 6),(shared_ptr<Quest> *)local_5e0);
    _Var21 = std::
             map<short,std::shared_ptr<Quest>,std::less<short>,std::allocator<std::pair<short_const,std::shared_ptr<Quest>>>>
             ::insert<std::pair<short,std::shared_ptr<Quest>>>
                       ((map<short,std::shared_ptr<Quest>,std::less<short>,std::allocator<std::pair<short_const,std::shared_ptr<Quest>>>>
                         *)&this->quests,&local_600);
    event = (TimeEvent *)_Var21.first._M_node;
    local_608 = _Var21.second;
    std::pair<short,_std::shared_ptr<Quest>_>::~pair(&local_600);
    std::shared_ptr<Quest>::~shared_ptr((shared_ptr<Quest> *)local_5e0);
  }
  sVar15 = std::
           map<short,_std::shared_ptr<Quest>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest>_>_>_>
           ::size(&this->quests);
  Console::Out("%i/%i quests loaded.",sVar15 & 0xffffffff,(ulong)(uint)(int)local_53c);
  this->last_character_id = 0;
  pTVar16 = (TimeEvent *)operator_new(0x30);
  TimeEvent::TimeEvent(pTVar16,world_spawn_npcs,this,1.0,-1);
  local_618 = pTVar16;
  Timer::Register(&this->timer,pTVar16);
  pTVar16 = (TimeEvent *)operator_new(0x30);
  TimeEvent::TimeEvent(pTVar16,world_act_npcs,this,0.05,-1);
  local_618 = pTVar16;
  Timer::Register(&this->timer,pTVar16);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_638,"RecoverSpeed",&local_639)
  ;
  pmVar9 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(this->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_638);
  iVar3 = util::variant::operator_cast_to_int(pmVar9);
  std::__cxx11::string::~string((string *)&local_638);
  std::allocator<char>::~allocator(&local_639);
  if (0 < iVar3) {
    pTVar16 = (TimeEvent *)operator_new(0x30);
    local_662 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_660,"RecoverSpeed",&local_661);
    pmVar9 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
             ::operator[](&(this->config).
                           super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                          ,&local_660);
    dVar19 = util::variant::operator_cast_to_double(pmVar9);
    TimeEvent::TimeEvent(pTVar16,world_recover,this,dVar19,-1);
    local_662 = 0;
    local_618 = pTVar16;
    std::__cxx11::string::~string((string *)&local_660);
    std::allocator<char>::~allocator(&local_661);
    Timer::Register(&this->timer,local_618);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_688,"NPCRecoverSpeed",&local_689);
  pmVar9 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(this->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_688);
  iVar3 = util::variant::operator_cast_to_int(pmVar9);
  std::__cxx11::string::~string((string *)&local_688);
  std::allocator<char>::~allocator(&local_689);
  if (0 < iVar3) {
    pTVar16 = (TimeEvent *)operator_new(0x30);
    local_6b2 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6b0,"NPCRecoverSpeed",&local_6b1);
    pmVar9 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
             ::operator[](&(this->config).
                           super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                          ,&local_6b0);
    dVar19 = util::variant::operator_cast_to_double(pmVar9);
    TimeEvent::TimeEvent(pTVar16,world_npc_recover,this,dVar19,-1);
    local_6b2 = 0;
    local_618 = pTVar16;
    std::__cxx11::string::~string((string *)&local_6b0);
    std::allocator<char>::~allocator(&local_6b1);
    Timer::Register(&this->timer,local_618);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6d8,"WarpSuck",&local_6d9);
  pmVar9 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(this->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_6d8);
  iVar3 = util::variant::operator_cast_to_int(pmVar9);
  std::__cxx11::string::~string((string *)&local_6d8);
  std::allocator<char>::~allocator(&local_6d9);
  if (0 < iVar3) {
    pTVar16 = (TimeEvent *)operator_new(0x30);
    TimeEvent::TimeEvent(pTVar16,world_warp_suck,this,1.0,-1);
    local_618 = pTVar16;
    Timer::Register(&this->timer,pTVar16);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_700,"ItemDespawn",&local_701);
  pmVar9 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(this->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_700);
  bVar2 = util::variant::operator_cast_to_bool(pmVar9);
  std::__cxx11::string::~string((string *)&local_700);
  std::allocator<char>::~allocator(&local_701);
  if (bVar2) {
    pTVar16 = (TimeEvent *)operator_new(0x30);
    local_72a = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_728,"ItemDespawnCheck",&local_729);
    pmVar9 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
             ::operator[](&(this->config).
                           super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                          ,&local_728);
    dVar19 = util::variant::operator_cast_to_double(pmVar9);
    TimeEvent::TimeEvent(pTVar16,world_despawn_items,this,dVar19,-1);
    local_72a = 0;
    local_618 = pTVar16;
    std::__cxx11::string::~string((string *)&local_728);
    std::allocator<char>::~allocator(&local_729);
    Timer::Register(&this->timer,local_618);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_750,"TimedSave",&local_751);
  pmVar9 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(this->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_750);
  bVar2 = util::variant::operator_cast_to_bool(pmVar9);
  std::__cxx11::string::~string((string *)&local_750);
  std::allocator<char>::~allocator(&local_751);
  if (bVar2) {
    pTVar16 = (TimeEvent *)operator_new(0x30);
    local_77a = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_778,"TimedSave",&local_779);
    pmVar9 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
             ::operator[](&(this->config).
                           super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                          ,&local_778);
    dVar19 = util::variant::operator_cast_to_double(pmVar9);
    TimeEvent::TimeEvent(pTVar16,world_timed_save,this,dVar19,-1);
    local_77a = 0;
    local_618 = pTVar16;
    std::__cxx11::string::~string((string *)&local_778);
    std::allocator<char>::~allocator(&local_779);
    Timer::Register(&this->timer,local_618);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7a0,"SpikeTime",&local_7a1);
  pmVar9 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(this->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_7a0);
  bVar2 = util::variant::operator_cast_to_bool(pmVar9);
  std::__cxx11::string::~string((string *)&local_7a0);
  std::allocator<char>::~allocator(&local_7a1);
  if (bVar2) {
    pTVar16 = (TimeEvent *)operator_new(0x30);
    local_7ca = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_7c8,"SpikeTime",&local_7c9);
    pmVar9 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
             ::operator[](&(this->config).
                           super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                          ,&local_7c8);
    dVar19 = util::variant::operator_cast_to_double(pmVar9);
    TimeEvent::TimeEvent(pTVar16,world_spikes,this,dVar19,-1);
    local_7ca = 0;
    local_618 = pTVar16;
    std::__cxx11::string::~string((string *)&local_7c8);
    std::allocator<char>::~allocator(&local_7c9);
    Timer::Register(&this->timer,local_618);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7f0,"DrainTime",&local_7f1);
  pmVar9 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(this->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_7f0);
  bVar2 = util::variant::operator_cast_to_bool(pmVar9);
  std::__cxx11::string::~string((string *)&local_7f0);
  std::allocator<char>::~allocator(&local_7f1);
  if (bVar2) {
    pTVar16 = (TimeEvent *)operator_new(0x30);
    local_81a = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_818,"DrainTime",&local_819);
    pmVar9 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
             ::operator[](&(this->config).
                           super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                          ,&local_818);
    dVar19 = util::variant::operator_cast_to_double(pmVar9);
    TimeEvent::TimeEvent(pTVar16,world_drains,this,dVar19,-1);
    local_81a = 0;
    local_618 = pTVar16;
    std::__cxx11::string::~string((string *)&local_818);
    std::allocator<char>::~allocator(&local_819);
    Timer::Register(&this->timer,local_618);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_840,"QuakeRate",&local_841);
  pmVar9 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(this->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_840);
  bVar2 = util::variant::operator_cast_to_bool(pmVar9);
  std::__cxx11::string::~string((string *)&local_840);
  std::allocator<char>::~allocator(&local_841);
  if (bVar2) {
    pTVar16 = (TimeEvent *)operator_new(0x30);
    i_3._6_1_ = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_868,"QuakeRate",(allocator<char> *)((long)&i_3 + 7));
    pmVar9 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
             ::operator[](&(this->config).
                           super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                          ,&local_868);
    dVar19 = util::variant::operator_cast_to_double(pmVar9);
    TimeEvent::TimeEvent(pTVar16,world_quakes,this,dVar19,-1);
    i_3._6_1_ = 0;
    local_618 = pTVar16;
    std::__cxx11::string::~string((string *)&local_868);
    std::allocator<char>::~allocator((allocator<char> *)((long)&i_3 + 7));
    Timer::Register(&this->timer,local_618);
  }
  pvVar17 = std::array<int,_254UL>::operator[](&this->exp_table,0);
  *pvVar17 = 0;
  for (i_4 = 1; sVar12 = std::array<int,_254UL>::size(&this->exp_table), i_4 < sVar12; i_4 = i_4 + 1
      ) {
    auVar20._8_4_ = (int)(i_4 >> 0x20);
    auVar20._0_8_ = i_4;
    auVar20._12_4_ = 0x45300000;
    dVar19 = pow((auVar20._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)i_4) - 4503599627370496.0),3.0);
    dVar19 = util::round(dVar19 * 133.1);
    pvVar17 = std::array<int,_254UL>::operator[](&this->exp_table,i_4);
    *pvVar17 = (int)dVar19;
  }
  for (local_880 = 0; sVar12 = std::array<Board_*,_8UL>::size(&this->boards), local_880 < sVar12;
      local_880 = local_880 + 1) {
    this_09 = (Board *)operator_new(0x20);
    Board::Board(this_09,(int)local_880);
    ppBVar18 = std::array<Board_*,_8UL>::operator[](&this->boards,local_880);
    *ppBVar18 = this_09;
  }
  this_10 = (GuildManager *)operator_new(0x80);
  GuildManager::GuildManager(this_10,this);
  this->guildmanager = this_10;
  std::__cxx11::string::~string(local_a8);
  return;
}

Assistant:

World::World(std::array<std::string, 6> dbinfo, const Config &eoserv_config, const Config &admin_config)
	: i18n(eoserv_config.find("ServerLanguage")->second)
	, admin_count(0)
{
	if (int(this->timer.resolution * 1000.0) > 1)
	{
		Console::Out("Timers set at approx. %i ms resolution", int(this->timer.resolution * 1000.0));
	}
	else
	{
		Console::Out("Timers set at < 1 ms resolution");
	}

	this->config = eoserv_config;
	this->admin_config = admin_config;

	Database::Engine engine;

	std::string dbdesc;

	if (util::lowercase(dbinfo[0]).compare("sqlite") == 0)
	{
		engine = Database::SQLite;
		dbdesc = std::string("SQLite: ")
		       + dbinfo[1];
	}
	else
	{
		engine = Database::MySQL;
		dbdesc = std::string("MySQL: ")
		       + dbinfo[2] + "@"
		       + dbinfo[1];

		if (dbinfo[5] != "0" && dbinfo[5] != "3306")
			dbdesc += ":" + dbinfo[5];

		dbdesc += "/" + dbinfo[4];
	}

	Console::Out("Connecting to database (%s)...", dbdesc.c_str());
	this->db.Connect(engine, dbinfo[1], util::to_int(dbinfo[5]), dbinfo[2], dbinfo[3], dbinfo[4]);
	this->BeginDB();

	this->drops_config.Read(this->config["DropsFile"]);
	this->shops_config.Read(this->config["ShopsFile"]);
	this->arenas_config.Read(this->config["ArenasFile"]);
	this->formulas_config.Read(this->config["FormulasFile"]);
	this->home_config.Read(this->config["HomeFile"]);
	this->skills_config.Read(this->config["SkillsFile"]);

	this->UpdateConfig();
	this->LoadHome();

	bool auto_split = this->config["AutoSplitPubFiles"];

	this->eif = new EIF(this->config["EIF"], auto_split);
	this->enf = new ENF(this->config["ENF"], auto_split);
	this->esf = new ESF(this->config["ESF"], auto_split);
	this->ecf = new ECF(this->config["ECF"], auto_split);

	std::size_t num_npcs = this->enf->data.size();
	this->npc_data.resize(num_npcs);
	for (std::size_t i = 0; i < num_npcs; ++i)
	{
		auto& npc = this->npc_data[i];
		npc.reset(new NPC_Data(this, i));
		if (npc->id != 0)
			npc->LoadShopDrop();
	}

	this->maps.resize(static_cast<int>(this->config["Maps"]));
	int loaded = 0;
	for (int i = 0; i < static_cast<int>(this->config["Maps"]); ++i)
	{
		this->maps[i] = new Map(i + 1, this);
		if (this->maps[i]->exists)
			++loaded;
	}
	Console::Out("%i/%i maps loaded.", loaded, static_cast<int>(this->maps.size()));

	short max_quest = static_cast<int>(this->config["Quests"]);

	UTIL_FOREACH(this->enf->data, npc)
	{
		if (npc.type == ENF::Quest)
			max_quest = std::max(max_quest, npc.vendor_id);
	}

	for (short i = 0; i <= max_quest; ++i)
	{
		try
		{
			std::shared_ptr<Quest> q = std::make_shared<Quest>(i, this);
			this->quests.insert(std::make_pair(i, std::move(q)));
		}
		catch (...)
		{

		}
	}
	Console::Out("%i/%i quests loaded.", static_cast<int>(this->quests.size()), max_quest);

	this->last_character_id = 0;

	TimeEvent *event = new TimeEvent(world_spawn_npcs, this, 1.0, Timer::FOREVER);
	this->timer.Register(event);

	event = new TimeEvent(world_act_npcs, this, 0.05, Timer::FOREVER);
	this->timer.Register(event);

	if (int(this->config["RecoverSpeed"]) > 0)
	{
		event = new TimeEvent(world_recover, this, double(this->config["RecoverSpeed"]), Timer::FOREVER);
		this->timer.Register(event);
	}

	if (int(this->config["NPCRecoverSpeed"]) > 0)
	{
		event = new TimeEvent(world_npc_recover, this, double(this->config["NPCRecoverSpeed"]), Timer::FOREVER);
		this->timer.Register(event);
	}

	if (int(this->config["WarpSuck"]) > 0)
	{
		event = new TimeEvent(world_warp_suck, this, 1.0, Timer::FOREVER);
		this->timer.Register(event);
	}

	if (this->config["ItemDespawn"])
	{
		event = new TimeEvent(world_despawn_items, this, static_cast<double>(this->config["ItemDespawnCheck"]), Timer::FOREVER);
		this->timer.Register(event);
	}

	if (this->config["TimedSave"])
	{
		event = new TimeEvent(world_timed_save, this, static_cast<double>(this->config["TimedSave"]), Timer::FOREVER);
		this->timer.Register(event);
	}

	if (this->config["SpikeTime"])
	{
		event = new TimeEvent(world_spikes, this, static_cast<double>(this->config["SpikeTime"]), Timer::FOREVER);
		this->timer.Register(event);
	}

	if (this->config["DrainTime"])
	{
		event = new TimeEvent(world_drains, this, static_cast<double>(this->config["DrainTime"]), Timer::FOREVER);
		this->timer.Register(event);
	}

	if (this->config["QuakeRate"])
	{
		event = new TimeEvent(world_quakes, this, static_cast<double>(this->config["QuakeRate"]), Timer::FOREVER);
		this->timer.Register(event);
	}

	exp_table[0] = 0;
	for (std::size_t i = 1; i < this->exp_table.size(); ++i)
	{
		exp_table[i] = int(util::round(std::pow(double(i), 3.0) * 133.1));
	}

	for (std::size_t i = 0; i < this->boards.size(); ++i)
	{
		this->boards[i] = new Board(i);
	}

	this->guildmanager = new GuildManager(this);
}